

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom-bounds-load.cpp
# Opt level: O2

void __thiscall Block::print_data(Block *this,ProxyWithLink *cp)

{
  pointer piVar1;
  long lVar2;
  size_t i;
  ulong uVar3;
  int local_2c;
  
  local_2c = (cp->super_Proxy).gid_;
  fmt::v7::print<char[9],int,char>(_stderr,(char (*) [9])"gid {}:\n",&local_2c);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    piVar1 = (this->vals).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->vals).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar3) break;
    fmt::v7::print<char[4],int&,char>(_stderr,(char (*) [4])"{} ",(int *)((long)piVar1 + lVar2));
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 4;
  }
  fmt::v7::print<char[2],,char>(_stderr,(char (*) [2])0x128405);
  return;
}

Assistant:

void print_data(const diy::Master::ProxyWithLink&     cp)
    {
        fmt::print(stderr, "gid {}:\n", cp.gid());
        for (size_t i = 0; i < vals.size(); i++)
            fmt::print(stderr, "{} ", vals[i]);
        fmt::print(stderr, "\n");
    }